

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveMipsArch(Parser *parser,int flags)

{
  int in_EDX;
  undefined4 in_register_00000034;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_48;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_40;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_38;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_30;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_28;
  int local_1c;
  undefined8 uStack_18;
  int flags_local;
  Parser *parser_local;
  
  uStack_18 = CONCAT44(in_register_00000034,flags);
  local_1c = in_EDX;
  parser_local = parser;
  Architecture::setCurrent(&Mips.super_Architecture);
  CMipsArchitecture::SetLoadDelay(&Mips,false,0);
  if (local_1c - 1U < 4 || local_1c == 5) {
    switch((long)&switchD_00206751::switchdataD_00229e40 +
           (long)(int)(&switchD_00206751::switchdataD_00229e40)[local_1c - 1U]) {
    case 0x206753:
      CMipsArchitecture::SetVersion(&Mips,MARCH_PSX);
      std::make_unique<ArchitectureCommand,char_const(&)[5],char_const(&)[1]>
                ((char (*) [5])&local_28,(char (*) [1])".psx");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_28);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_28);
      break;
    case 0x206793:
      CMipsArchitecture::SetVersion(&Mips,MARCH_PS2);
      std::make_unique<ArchitectureCommand,char_const(&)[5],char_const(&)[1]>
                ((char (*) [5])&local_30,(char (*) [1])".ps2");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_30);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_30);
      break;
    case 0x2067d6:
      CMipsArchitecture::SetVersion(&Mips,MARCH_PSP);
      std::make_unique<ArchitectureCommand,char_const(&)[5],char_const(&)[1]>
                ((char (*) [5])&local_38,(char (*) [1])".psp");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_38);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_38);
      break;
    case 0x206819:
      CMipsArchitecture::SetVersion(&Mips,MARCH_N64);
      std::make_unique<ArchitectureCommand,char_const(&)[5],char_const(&)[1]>
                ((char (*) [5])&local_40,(char (*) [1])".n64");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_40);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_40);
      break;
    case 0x206859:
      CMipsArchitecture::SetVersion(&Mips,MARCH_RSP);
      std::make_unique<ArchitectureCommand,char_const(&)[5],char_const(&)[1]>
                ((char (*) [5])&local_48,(char (*) [1])".rsp");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_48);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_48);
    }
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveMipsArch(Parser& parser, int flags)
{
	Architecture::setCurrent(Mips);
	Mips.SetLoadDelay(false, 0);

	switch (flags)
	{
	case DIRECTIVE_MIPS_PSX:
		Mips.SetVersion(MARCH_PSX);
		return std::make_unique<ArchitectureCommand>(".psx", "");
	case DIRECTIVE_MIPS_PS2:
		Mips.SetVersion(MARCH_PS2);
		return std::make_unique<ArchitectureCommand>(".ps2", "");
	case DIRECTIVE_MIPS_PSP:
		Mips.SetVersion(MARCH_PSP);
		return std::make_unique<ArchitectureCommand>(".psp", "");
	case DIRECTIVE_MIPS_N64:
		Mips.SetVersion(MARCH_N64);
		return std::make_unique<ArchitectureCommand>(".n64", "");
	case DIRECTIVE_MIPS_RSP:
		Mips.SetVersion(MARCH_RSP);
		return std::make_unique<ArchitectureCommand>(".rsp", "");
	}

	return nullptr;
}